

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O0

string * __thiscall
t_dart_generator::generate_isset_check_abi_cxx11_
          (string *__return_storage_ptr__,t_dart_generator *this,t_field *field)

{
  string *psVar1;
  string local_90;
  string local_60;
  undefined1 local_40 [8];
  string field_name;
  t_field *field_local;
  t_dart_generator *this_local;
  
  field_name.field_2._8_8_ = field;
  psVar1 = t_field::get_name_abi_cxx11_(field);
  std::__cxx11::string::string((string *)&local_60,(string *)psVar1);
  get_member_name((string *)local_40,this,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::string((string *)&local_90,(string *)local_40);
  generate_isset_check(__return_storage_ptr__,this,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string t_dart_generator::generate_isset_check(t_field* field) {
  string field_name = get_member_name(field->get_name());
  return generate_isset_check(field_name);
}